

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrappers.hpp
# Opt level: O2

__pid_t __thiscall pcplusplus::threads::generic_threads::fork(generic_threads *this)

{
  __pid_t extraout_EAX;
  size_t i;
  ulong uVar1;
  long lVar2;
  generic_threads *local_78;
  type local_70 [4];
  thread local_50 [4];
  
  lock(this);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < this->num_threads; uVar1 = uVar1 + 1) {
    local_70[0] = 1;
    local_70[1] = 0;
    local_78 = this;
    std::thread::
    thread<void(pcplusplus::threads::generic_threads::*)(),pcplusplus::threads::generic_threads*,void>
              (local_50,local_70,&local_78);
    std::thread::operator=
              ((thread *)
               ((long)&(((this->threads)._M_t.
                         super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
                         super__Head_base<0UL,_std::thread_*,_false>._M_head_impl)->_M_id)._M_thread
               + lVar2),local_50);
    std::thread::~thread(local_50);
    lVar2 = lVar2 + 8;
  }
  unlock(this);
  return extraout_EAX;
}

Assistant:

virtual inline void fork(){
		lock();
		try{
		    for(size_t i = 0; i < num_threads; ++i)
			threads[i] = std::thread(&generic_threads::thread_routine, this);
		}
		catch(const std::system_error& e){
		    throw exceptions::thread_failure("Failed to fork a " + thread_type + " thread.");
		}
		unlock();
	    }